

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

stStackMem_t * co_alloc_stackmem(uint stack_size)

{
  stStackMem_t *psVar1;
  char *pcVar2;
  stStackMem_t *stack_mem;
  uint stack_size_local;
  
  psVar1 = (stStackMem_t *)malloc(0x20);
  psVar1->occupy_co = (stCoRoutine_t *)0x0;
  psVar1->stack_size = stack_size;
  pcVar2 = (char *)malloc((ulong)stack_size);
  psVar1->stack_buffer = pcVar2;
  psVar1->stack_bp = psVar1->stack_buffer + stack_size;
  return psVar1;
}

Assistant:

stStackMem_t* co_alloc_stackmem(unsigned int stack_size)
{
	stStackMem_t* stack_mem = (stStackMem_t*)malloc(sizeof(stStackMem_t));
	stack_mem->occupy_co= NULL;
	stack_mem->stack_size = stack_size;
	stack_mem->stack_buffer = (char*)malloc(stack_size);
	stack_mem->stack_bp = stack_mem->stack_buffer + stack_size;
	return stack_mem;
}